

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSSOR.cpp
# Opt level: O3

double __thiscall chrono::ChSolverPSSOR::Solve(ChSolverPSSOR *this,ChSystemDescriptor *sysd)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  ChConstraint *pCVar3;
  ChVariables *this_00;
  ChConstraint *pCVar4;
  ChConstraint *pCVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double old_lambda_friction [3];
  double gi_values [3];
  double local_150;
  undefined1 local_148 [16];
  double local_118 [4];
  double local_f8;
  undefined8 uStack_f0;
  long local_e0;
  ulong local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8 [3];
  long local_a0;
  long local_98;
  long local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  this->maxviolation = 0.0;
  uVar23 = (ulong)((long)(sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar30 = (ulong)((long)(sysd->vvariables).
                         super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sysd->vvariables).
                        super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar28 = (int)uVar23;
  if (iVar28 != 0) {
    uVar29 = 0;
    do {
      (*(sysd->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar29]->_vptr_ChConstraint[6])();
      uVar29 = uVar29 + 1;
    } while ((uVar23 & 0xffffffff) != uVar29);
    if (iVar28 != 0) {
      ppCVar2 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar26 = 0xffffffff;
      uVar29 = 0;
      iVar25 = 0;
      do {
        pCVar3 = ppCVar2[uVar29];
        if (pCVar3->mode == CONSTRAINT_FRIC) {
          local_b8[iVar25] = pCVar3->g_i;
          iVar25 = iVar25 + 1;
          if (iVar25 == 3) {
            dVar46 = (local_b8[0] + local_b8[1] + local_b8[2]) / 3.0;
            ppCVar2[uVar26 - 1]->g_i = dVar46;
            ppCVar2[uVar26]->g_i = dVar46;
            iVar25 = 0;
            pCVar3->g_i = dVar46;
          }
        }
        uVar29 = uVar29 + 1;
        uVar26 = uVar26 + 1;
      } while ((uVar23 & 0xffffffff) != uVar29);
    }
  }
  if ((int)uVar30 != 0) {
    uVar29 = 0;
    do {
      this_00 = (sysd->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar29];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar29]);
        local_88 = 0;
        uStack_80 = 0;
        local_a0 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        local_98 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_a0);
        if (local_88 != 0) {
          free(*(void **)(local_88 + -8));
        }
      }
      uVar29 = uVar29 + 1;
    } while ((uVar30 & 0xffffffff) != uVar29);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (iVar28 != 0) {
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar34 = vpbroadcastq_avx512f();
      uVar30 = 0;
      do {
        auVar35 = vpbroadcastq_avx512f();
        auVar35 = vporq_avx512f(auVar35,auVar45);
        uVar29 = vpcmpuq_avx512f(auVar35,auVar34,2);
        auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                     ((sysd->vconstraints).
                                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar30));
        auVar36._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * auVar35._8_8_;
        auVar36._0_8_ = (ulong)((byte)uVar29 & 1) * auVar35._0_8_;
        auVar36._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * auVar35._16_8_;
        auVar36._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * auVar35._24_8_;
        auVar36._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * auVar35._32_8_;
        auVar36._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * auVar35._40_8_;
        auVar36._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * auVar35._48_8_;
        auVar36._56_8_ = (uVar29 >> 7) * auVar35._56_8_;
        uVar30 = uVar30 + 8;
        vscatterqpd_avx512f(ZEXT864(0x10) + auVar36,uVar29,ZEXT864(0) << 0x40);
      } while (((uVar23 & 0xffffffff) + 7 & 0xfffffffffffffff8) != uVar30);
    }
  }
  else if (iVar28 != 0) {
    uVar30 = 0;
    do {
      pCVar3 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar30];
      if (pCVar3->active == true) {
        (*pCVar3->_vptr_ChConstraint[8])(pCVar3->l_i);
      }
      uVar30 = uVar30 + 1;
    } while ((uVar23 & 0xffffffff) != uVar30);
  }
  uVar30 = (ulong)(iVar28 - 1);
  local_e0 = (uVar23 & 0xffffffff) << 3;
  uVar26 = 0;
  local_d0 = uVar30 + 1;
  local_c8 = 0x7fffffffffffffff;
  uStack_c0 = 0x7fffffffffffffff;
  local_d8 = uVar30;
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar26) {
      return this->maxviolation;
    }
    this->maxviolation = 0.0;
    lVar27 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar27 == 0) {
      dVar46 = 0.0;
      local_150 = 0.0;
    }
    else {
      lVar27 = lVar27 >> 3;
      auVar45 = ZEXT1664(ZEXT816(0));
      local_150 = 0.0;
      iVar28 = 0;
      lVar24 = 0;
      do {
        pCVar3 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar24];
        if (pCVar3->active == true) {
          dVar46 = auVar45._0_8_;
          (*pCVar3->_vptr_ChConstraint[7])();
          pCVar3 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar24];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = pCVar3->cfm_i;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = pCVar3->l_i;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar46 + pCVar3->b_i;
          auVar33 = vfmadd132sd_fma(auVar32,auVar47,auVar33);
          auVar32 = auVar33;
          (*pCVar3->_vptr_ChConstraint[0xc])();
          ppCVar2 = (sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar3 = ppCVar2[lVar24];
          auVar31._8_8_ = 0x8000000000000000;
          auVar31._0_8_ = 0x8000000000000000;
          auVar31 = vxorpd_avx512vl(auVar33,auVar31);
          dVar46 = pCVar3->l_i;
          dVar60 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar31._0_8_ +
                   dVar46;
          if (pCVar3->mode == CONSTRAINT_FRIC) {
            local_118[iVar28] = dVar46;
            pCVar3->l_i = dVar60;
            if (iVar28 == 0) {
              auVar12._8_8_ = 0x7fffffffffffffff;
              auVar12._0_8_ = 0x7fffffffffffffff;
              auVar31 = vandpd_avx512vl(auVar33,auVar12);
              iVar28 = 1;
              uVar8 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar33,1);
              auVar50._8_8_ = auVar31._8_8_;
              auVar50._0_8_ = (ulong)!(bool)((byte)uVar8 & 1) * auVar31._0_8_;
            }
            else {
              iVar28 = iVar28 + 1;
              auVar50 = ZEXT816(0);
              if (iVar28 == 3) {
                (*ppCVar2[lVar24 + -2]->_vptr_ChConstraint[0xb])();
                ppCVar2 = (sysd->vconstraints).
                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                dVar46 = (this->super_ChIterativeSolverVI).m_shlambda;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = dVar46;
                pCVar3 = ppCVar2[lVar24 + -2];
                pCVar4 = ppCVar2[lVar24 + -1];
                pCVar5 = ppCVar2[lVar24];
                local_f8 = pCVar3->l_i;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = local_f8;
                dVar60 = pCVar4->l_i;
                auVar48._8_8_ = 0;
                auVar48._0_8_ = dVar60;
                local_148._0_8_ = pCVar5->l_i;
                auVar61._8_8_ = 0;
                auVar61._0_8_ = local_148._0_8_;
                if ((dVar46 != 1.0) || (NAN(dVar46))) {
                  dVar46 = 1.0 - dVar46;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = dVar46 * local_118[0];
                  auVar33 = vfmadd213sd_fma(auVar38,auVar66,auVar70);
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = dVar46 * local_118[1];
                  auVar31 = vfmadd213sd_fma(auVar48,auVar66,auVar72);
                  dVar60 = auVar31._0_8_;
                  auVar68._8_8_ = 0;
                  auVar68._0_8_ = dVar46 * local_118[2];
                  auVar31 = vfmadd213sd_fma(auVar61,auVar66,auVar68);
                  local_f8 = auVar33._0_8_;
                  pCVar3->l_i = local_f8;
                  pCVar4->l_i = dVar60;
                  local_148._0_8_ = auVar31._0_8_;
                  pCVar5->l_i = (double)local_148._0_8_;
                }
                dVar60 = dVar60 - local_118[1];
                local_f8 = local_f8 - local_118[0];
                local_148._0_8_ = (double)local_148._0_8_ - local_118[2];
                uStack_f0 = 0;
                local_148._8_8_ = 0;
                (*pCVar3->_vptr_ChConstraint[8])();
                (*(sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24 + -1]->_vptr_ChConstraint[8])
                          (dVar60);
                (*(sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24]->_vptr_ChConstraint[8])
                          (local_148._0_8_);
                iVar28 = 0;
                if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                  auVar20._8_8_ = uStack_c0;
                  auVar20._0_8_ = local_c8;
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = local_150;
                  auVar18._8_8_ = uStack_f0;
                  auVar18._0_8_ = local_f8;
                  auVar33 = vandpd_avx(auVar20,auVar18);
                  auVar31 = vmaxsd_avx(auVar49,auVar33);
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = dVar60;
                  auVar33 = vandpd_avx(auVar20,auVar14);
                  auVar31 = vmaxsd_avx(auVar31,auVar33);
                  auVar33 = vandpd_avx(auVar20,local_148);
                  auVar33 = vmaxsd_avx(auVar31,auVar33);
                  local_150 = auVar33._0_8_;
                }
                auVar50 = SUB6416(ZEXT864(0),0) << 0x40;
              }
            }
          }
          else {
            pCVar3->l_i = dVar60;
            (*pCVar3->_vptr_ChConstraint[0xb])();
            dVar60 = (this->super_ChIterativeSolverVI).m_shlambda;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = dVar60;
            pCVar3 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar24];
            dVar37 = pCVar3->l_i;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar37;
            if ((dVar60 != 1.0) || (NAN(dVar60))) {
              auVar62._8_8_ = 0;
              auVar62._0_8_ = dVar46 * (1.0 - dVar60);
              auVar33 = vfmadd213sd_fma(auVar39,auVar51,auVar62);
              dVar37 = auVar33._0_8_;
              pCVar3->l_i = dVar37;
            }
            auVar52._8_8_ = 0x7fffffffffffffff;
            auVar52._0_8_ = 0x7fffffffffffffff;
            auVar50 = vandpd_avx(auVar52,auVar32);
            (*pCVar3->_vptr_ChConstraint[8])();
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = dVar37 - dVar46;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_150;
              auVar13._8_8_ = 0x7fffffffffffffff;
              auVar13._0_8_ = 0x7fffffffffffffff;
              auVar33 = vandpd_avx512vl(auVar15,auVar13);
              auVar33 = vmaxsd_avx(auVar53,auVar33);
              local_150 = auVar33._0_8_;
            }
          }
          auVar40._8_8_ = 0;
          auVar40._0_8_ = this->maxviolation;
          auVar33 = vmaxsd_avx(auVar40,auVar50);
          auVar45 = ZEXT1664(auVar33);
          this->maxviolation = auVar33._0_8_;
        }
        dVar46 = auVar45._0_8_;
        lVar24 = lVar24 + 1;
      } while (lVar27 + (ulong)(lVar27 == 0) != lVar24);
    }
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd(&this->super_ChIterativeSolverVI,dVar46,local_150,uVar26);
    }
    lVar27 = local_e0;
    this->maxviolation = 0.0;
    if ((int)local_d8 < 0) {
      dVar46 = 0.0;
      local_150 = 0.0;
    }
    else {
      auVar45 = ZEXT1664(ZEXT816(0));
      lVar24 = 0;
      iVar28 = 0;
      local_150 = 0.0;
      do {
        pCVar3 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar30 + lVar24];
        if (pCVar3->active == true) {
          dVar46 = auVar45._0_8_;
          (*pCVar3->_vptr_ChConstraint[7])();
          pCVar3 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar30 + lVar24];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = pCVar3->cfm_i;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pCVar3->l_i;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar46 + pCVar3->b_i;
          auVar33 = vfmadd132sd_fma(auVar41,auVar54,auVar1);
          auVar31 = auVar33;
          (*pCVar3->_vptr_ChConstraint[0xc])();
          pCVar3 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar30 + lVar24];
          auVar9._8_8_ = 0x8000000000000000;
          auVar9._0_8_ = 0x8000000000000000;
          auVar32 = vxorpd_avx512vl(auVar33,auVar9);
          dVar46 = pCVar3->l_i;
          dVar60 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar32._0_8_ +
                   dVar46;
          if (pCVar3->mode == CONSTRAINT_FRIC) {
            auVar65 = SUB6416(ZEXT864(0),0) << 0x40;
            local_118[iVar28] = dVar46;
            iVar28 = iVar28 + 1;
            pCVar3->l_i = dVar60;
            if (iVar28 == 3) {
              (*pCVar3->_vptr_ChConstraint[0xb])();
              ppCVar2 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar46 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = dVar46;
              lVar6 = *(long *)((long)ppCVar2 + lVar24 * 8 + lVar27);
              plVar7 = *(long **)((long)ppCVar2 + lVar24 * 8 + lVar27 + 8);
              pCVar3 = ppCVar2[uVar30 + lVar24];
              local_78 = (double)plVar7[2];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_78;
              local_f8 = *(double *)(lVar6 + 0x10);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = local_f8;
              dVar60 = pCVar3->l_i;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = dVar60;
              if ((dVar46 != 1.0) || (NAN(dVar46))) {
                dVar46 = 1.0 - dVar46;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = dVar46 * local_118[0];
                auVar31 = vfmadd213sd_fma(auVar42,auVar67,auVar71);
                auVar73._8_8_ = 0;
                auVar73._0_8_ = dVar46 * local_118[1];
                auVar32 = vfmadd213sd_fma(auVar55,auVar67,auVar73);
                local_f8 = auVar32._0_8_;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = dVar46 * local_118[2];
                auVar32 = vfmadd213sd_fma(auVar63,auVar67,auVar69);
                local_78 = auVar31._0_8_;
                plVar7[2] = (long)local_78;
                *(double *)(lVar6 + 0x10) = local_f8;
                dVar60 = auVar32._0_8_;
                pCVar3->l_i = dVar60;
              }
              local_f8 = local_f8 - local_118[1];
              local_78 = local_78 - local_118[0];
              uStack_f0 = 0;
              dVar60 = dVar60 - local_118[2];
              uStack_70 = 0;
              (**(code **)(*plVar7 + 0x40))();
              (**(code **)(**(long **)((long)(sysd->vconstraints).
                                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar24 * 8 + lVar27) + 0x40))(local_f8);
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar30 + lVar24]->_vptr_ChConstraint[8])();
              iVar28 = 0;
              auVar10._8_8_ = 0x7fffffffffffffff;
              auVar10._0_8_ = 0x7fffffffffffffff;
              auVar31 = vandpd_avx512vl(auVar33,auVar10);
              uVar8 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar33,1);
              auVar65._8_8_ = auVar31._8_8_;
              auVar65._0_8_ = (ulong)!(bool)((byte)uVar8 & 1) * auVar31._0_8_;
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar21._8_8_ = uStack_c0;
                auVar21._0_8_ = local_c8;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = local_150;
                auVar22._8_8_ = uStack_70;
                auVar22._0_8_ = local_78;
                auVar33 = vandpd_avx(auVar21,auVar22);
                auVar31 = vmaxsd_avx(auVar56,auVar33);
                auVar19._8_8_ = uStack_f0;
                auVar19._0_8_ = local_f8;
                auVar33 = vandpd_avx(auVar21,auVar19);
                auVar31 = vmaxsd_avx(auVar31,auVar33);
                auVar16._8_8_ = 0;
                auVar16._0_8_ = dVar60;
                auVar33 = vandpd_avx(auVar21,auVar16);
                auVar33 = vmaxsd_avx(auVar31,auVar33);
                local_150 = auVar33._0_8_;
              }
            }
          }
          else {
            pCVar3->l_i = dVar60;
            (*pCVar3->_vptr_ChConstraint[0xb])();
            dVar60 = (this->super_ChIterativeSolverVI).m_shlambda;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = dVar60;
            pCVar3 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar30 + lVar24];
            dVar37 = pCVar3->l_i;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = dVar37;
            if ((dVar60 != 1.0) || (NAN(dVar60))) {
              auVar64._8_8_ = 0;
              auVar64._0_8_ = dVar46 * (1.0 - dVar60);
              auVar33 = vfmadd213sd_fma(auVar43,auVar57,auVar64);
              dVar37 = auVar33._0_8_;
              pCVar3->l_i = dVar37;
            }
            auVar58._8_8_ = 0x7fffffffffffffff;
            auVar58._0_8_ = 0x7fffffffffffffff;
            auVar65 = vandpd_avx(auVar58,auVar31);
            (*pCVar3->_vptr_ChConstraint[8])();
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = dVar37 - dVar46;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_150;
              auVar11._8_8_ = 0x7fffffffffffffff;
              auVar11._0_8_ = 0x7fffffffffffffff;
              auVar33 = vandpd_avx512vl(auVar17,auVar11);
              auVar33 = vmaxsd_avx(auVar59,auVar33);
              local_150 = auVar33._0_8_;
            }
          }
          auVar44._8_8_ = 0;
          auVar44._0_8_ = this->maxviolation;
          auVar33 = vmaxsd_avx(auVar44,auVar65);
          auVar45 = ZEXT1664(auVar33);
          this->maxviolation = auVar33._0_8_;
        }
        dVar46 = auVar45._0_8_;
        lVar6 = local_d0 + -1 + lVar24;
        lVar24 = lVar24 + -1;
      } while (0 < lVar6);
    }
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd
                (&this->super_ChIterativeSolverVI,dVar46,local_150,uVar26 | 1);
      dVar46 = this->maxviolation;
    }
    uVar26 = uVar26 + 2;
  } while ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <= dVar46);
  return dVar46;
}

Assistant:

double ChSolverPSSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];
    const unsigned int nConstr = (unsigned int)mconstraints.size();
    const unsigned int nVars = (unsigned int)mvariables.size();

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < nConstr; ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < nConstr; ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:
    for (unsigned int iv = 0; iv < nVars; iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    for (int iter = 0; iter < m_max_iterations;) {
        //
        // Forward sweep, for symmetric SOR
        //
        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;
        size_t dummy = mconstraints.size();
        for (size_t ic = 0; ic < dummy; ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end constraint loop

        // Terminate the loop if violation in constraints has been successfully limited.
        // if (maxviolation < m_tolerance)
        //	break;

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Increment iter count (each sweep, either forward or backward, is considered
        // as a complete iteration, to be fair when comparing to the non-symmetric SOR :)
        iter++;

        //
        // Backward sweep, for symmetric SOR
        //
        maxviolation = 0.;
        maxdeltalambda = 0.;
        i_friction_comp = 0;

        for (int ic = (nConstr - 1); ic >= 0; ic--) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;
                    if (i_friction_comp == 3) {
                        mconstraints[ic]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic + 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic + 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic + 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic + 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic + 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic + 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic + 2]->Increment_q(true_delta_0);
                        mconstraints[ic + 1]->Increment_q(true_delta_1);
                        mconstraints[ic + 0]->Increment_q(true_delta_2);

                        candidate_violation = fabs(ChMin(0.0, mresidual));

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

        iter++;
    }

    return maxviolation;
}